

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::InlinePass::InlineSingleInstruction
          (InlinePass *this,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *callee2caller,BasicBlock *new_blk_ptr,Instruction *inst,uint32_t dbg_inlined_at)

{
  array<signed_char,_4UL> to;
  pointer pOVar1;
  uint **ppuVar2;
  ulong uVar3;
  IRContext *this_00;
  bool bVar4;
  char cVar5;
  uint32_t from;
  Instruction *this_01;
  _Hash_node_base *p_Var6;
  uint **ppuVar7;
  ulong uVar8;
  __node_base_ptr p_Var9;
  __node_base_ptr p_Var10;
  pointer pOVar11;
  undefined1 local_98 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_78;
  InlinePass *local_70;
  BasicBlock *local_68;
  uint *local_60;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  
  if (inst->opcode_ - OpReturn < 2) {
    return true;
  }
  local_70 = this;
  local_68 = new_blk_ptr;
  this_01 = Instruction::Clone(inst,(this->super_Pass).context_);
  local_98._0_8_ = &local_58;
  uStack_50 = 0;
  pcStack_40 = std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_pass.cpp:354:24)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_pass.cpp:354:24)>
             ::_M_manager;
  local_98._8_8_ = 0;
  local_98._24_8_ =
       std::
       _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:830:17)>
       ::_M_invoke;
  local_98._16_8_ =
       std::
       _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:830:17)>
       ::_M_manager;
  pOVar11 = (this_01->operands_).
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pOVar1 = (this_01->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_58 = callee2caller;
  if (pOVar11 != pOVar1) {
    do {
      bVar4 = spvIsInIdType(pOVar11->type);
      if (bVar4) {
        ppuVar2 = (uint **)(pOVar11->words).large_data_._M_t.
                           super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           .
                           super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                           ._M_head_impl;
        ppuVar7 = &(pOVar11->words).small_data_;
        if (ppuVar2 != (uint **)0x0) {
          ppuVar7 = ppuVar2;
        }
        local_60 = *ppuVar7;
        if ((PodType  [2])local_98._16_8_ == (PodType  [2])0x0) {
          std::__throw_bad_function_call();
        }
        cVar5 = (*(code *)local_98._24_8_)(local_98,&local_60);
        if (cVar5 == '\0') break;
      }
      pOVar11 = pOVar11 + 1;
    } while (pOVar11 != pOVar1);
  }
  if ((PodType  [2])local_98._16_8_ != (PodType  [2])0x0) {
    (*(code *)local_98._16_8_)(local_98,local_98,3);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  from = 0;
  if (this_01->has_result_id_ == true) {
    from = Instruction::GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
  }
  if (from != 0) {
    uVar3 = (callee2caller->_M_h)._M_bucket_count;
    uVar8 = (ulong)from % uVar3;
    p_Var9 = (callee2caller->_M_h)._M_buckets[uVar8];
    p_Var10 = (__node_base_ptr)0x0;
    if ((p_Var9 != (__node_base_ptr)0x0) &&
       (p_Var6 = p_Var9->_M_nxt, p_Var10 = p_Var9, from != *(uint32_t *)&p_Var9->_M_nxt[1]._M_nxt))
    {
      while (p_Var9 = p_Var6, p_Var6 = p_Var9->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
        p_Var10 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var6[1]._M_nxt % uVar3 != uVar8) ||
           (p_Var10 = p_Var9, from == *(uint *)&p_Var6[1]._M_nxt)) goto LAB_00223388;
      }
      p_Var10 = (__node_base_ptr)0x0;
    }
LAB_00223388:
    if (p_Var10 == (__node_base_ptr)0x0) {
      p_Var6 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var6 = p_Var10->_M_nxt;
    }
    if (p_Var6 == (_Hash_node_base *)0x0) {
      bVar4 = false;
      goto LAB_00223466;
    }
    if (this_01->has_result_id_ == false) {
      __assert_fail("has_result_id_",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                    ,0x2c8,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
    }
    to._M_elems = *&((array<signed_char,_4UL> *)((long)&p_Var6[1]._M_nxt + 4))->_M_elems;
    if (to._M_elems == (_Type)0x0) {
      __assert_fail("res_id != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                    ,0x2cd,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
    }
    local_98._24_8_ = local_98 + 0x10;
    local_98._0_8_ = &PTR__SmallVector_003e9b28;
    local_78._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_98[0x10] = to._M_elems[0];
    local_98[0x11] = to._M_elems[1];
    local_98[0x12] = to._M_elems[2];
    local_98[0x13] = to._M_elems[3];
    local_98._8_8_ = 1;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)
               ((long)&((OperandData *)
                       ((((this_01->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_start)->words).buffer + -4))->
                       _vptr_SmallVector + (ulong)((uint)this_01->has_type_id_ * 0x30)),
               (SmallVector<unsigned_int,_2UL> *)local_98);
    local_98._0_8_ = &PTR__SmallVector_003e9b28;
    if (local_78._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_78,local_78._M_head_impl);
    }
    this_00 = (local_70->super_Pass).context_;
    if ((this_00->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
      IRContext::BuildDecorationManager(this_00);
    }
    analysis::DecorationManager::CloneDecorations
              ((this_00->decoration_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
               _M_head_impl,from,(uint32_t)to._M_elems);
  }
  Instruction::UpdateDebugInlinedAt(this_01,dbg_inlined_at);
  utils::IntrusiveList<spvtools::opt::Instruction>::push_back
            (&(local_68->insts_).super_IntrusiveList<spvtools::opt::Instruction>,this_01);
  bVar4 = true;
  this_01 = (Instruction *)0x0;
LAB_00223466:
  if (this_01 != (Instruction *)0x0) {
    (*(this_01->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase[1])
              (this_01);
  }
  return bVar4;
}

Assistant:

bool InlinePass::InlineSingleInstruction(
    const std::unordered_map<uint32_t, uint32_t>& callee2caller,
    BasicBlock* new_blk_ptr, const Instruction* inst, uint32_t dbg_inlined_at) {
  // If we have return, it must be at the end of the callee. We will handle
  // it at the end.
  if (inst->opcode() == spv::Op::OpReturnValue ||
      inst->opcode() == spv::Op::OpReturn)
    return true;

  // Copy callee instruction and remap all input Ids.
  std::unique_ptr<Instruction> cp_inst(inst->Clone(context()));
  cp_inst->ForEachInId([&callee2caller](uint32_t* iid) {
    const auto mapItr = callee2caller.find(*iid);
    if (mapItr != callee2caller.end()) {
      *iid = mapItr->second;
    }
  });

  // If result id is non-zero, remap it.
  const uint32_t rid = cp_inst->result_id();
  if (rid != 0) {
    const auto mapItr = callee2caller.find(rid);
    if (mapItr == callee2caller.end()) {
      return false;
    }
    uint32_t nid = mapItr->second;
    cp_inst->SetResultId(nid);
    get_decoration_mgr()->CloneDecorations(rid, nid);
  }

  cp_inst->UpdateDebugInlinedAt(dbg_inlined_at);
  new_blk_ptr->AddInstruction(std::move(cp_inst));
  return true;
}